

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vepu541_common.c
# Opt level: O0

MPP_RET vepu541_set_osd(Vepu541OsdCfg *cfg)

{
  RK_U32 RVar1;
  RK_U32 RVar2;
  void *pvVar3;
  MppDev ctx;
  MPP_RET MVar4;
  uint uVar5;
  uint *puVar6;
  uint *puVar7;
  size_t sVar8;
  RK_U32 buf_size;
  RK_S32 fd;
  size_t blk_len;
  Vepu541OsdPos *pos;
  MppEncOSDData2 *pMStack_1a8;
  RK_U32 num;
  MppEncOSDRegion2 *tmp;
  MppEncOSDRegion2 *region;
  undefined8 uStack_190;
  RK_U32 i;
  MppDevRegWrCfg wr_cfg;
  MppEncOSDData2 osd;
  MppEncOSDPltCfg *plt_cfg;
  MppDev dev;
  Vepu541OsdReg *regs;
  Vepu541OsdCfg *cfg_local;
  
  pvVar3 = cfg->reg_base;
  puVar6 = (uint *)((long)pvVar3 + 0x1c0);
  ctx = cfg->dev;
  osd.region[7].buf = cfg->plt_cfg;
  MVar4 = copy2osd2((MppEncOSDData2 *)&wr_cfg.size,cfg->osd_data,cfg->osd_data2);
  if (MVar4 == MPP_OK) {
    if (wr_cfg.size == 0) {
      cfg_local._4_4_ = MPP_OK;
    }
    else if (wr_cfg.size < 9) {
      if (*(int *)((long)osd.region[7].buf + 4) == 1) {
        uStack_190 = *(undefined8 *)((long)osd.region[7].buf + 8);
        wr_cfg.reg._0_4_ = 0x400;
        wr_cfg.reg._4_4_ = 0x400;
        mpp_dev_ioctl(ctx,4,&stack0xfffffffffffffe70);
        *puVar6 = *puVar6 & 0xfffeffff | 0x10000;
        *puVar6 = *puVar6 & 0xfffdffff;
      }
      else {
        *puVar6 = *puVar6 & 0xfffeffff;
        *puVar6 = *puVar6 & 0xfffdffff | 0x20000;
      }
      *puVar6 = *puVar6 & 0xffffff00;
      *puVar6 = *puVar6 & 0xffff00ff;
      pMStack_1a8 = &osd;
      for (region._4_4_ = 0; region._4_4_ < wr_cfg.size; region._4_4_ = region._4_4_ + 1) {
        *puVar6 = *puVar6 & 0xffffff00 |
                  *puVar6 & 0xff | pMStack_1a8->num_region << ((byte)region._4_4_ & 0x1f) & 0xff;
        *puVar6 = *puVar6 & 0xffff00ff |
                  (*puVar6 >> 8 & 0xff |
                  *(int *)&pMStack_1a8->field_0x4 << ((byte)region._4_4_ & 0x1f) & 0xffU) << 8;
        if (((pMStack_1a8->num_region != 0) && (pMStack_1a8->region[0].start_mb_x != 0)) &&
           (pMStack_1a8->region[0].start_mb_y != 0)) {
          puVar7 = (uint *)((long)pvVar3 + (ulong)region._4_4_ * 4 + 0x1d0);
          RVar1 = pMStack_1a8->region[0].start_mb_x;
          RVar2 = pMStack_1a8->region[0].start_mb_y;
          *puVar7 = *puVar7 & 0xffffff00 | pMStack_1a8->region[0].enable & 0xff;
          *puVar7 = *puVar7 & 0xffff00ff | (pMStack_1a8->region[0].inverse & 0xff) << 8;
          *puVar7 = *puVar7 & 0xff00ffff |
                    ((pMStack_1a8->region[0].enable + pMStack_1a8->region[0].start_mb_x) - 1 & 0xff)
                    << 0x10;
          *puVar7 = *puVar7 & 0xffffff |
                    (pMStack_1a8->region[0].inverse + pMStack_1a8->region[0].start_mb_y + -1) *
                    0x1000000;
          sVar8 = mpp_buffer_get_size_with_caller
                            (*(MppBuffer *)&pMStack_1a8->region[0].buf_offset,"vepu541_set_osd");
          uVar5 = mpp_buffer_get_fd_with_caller
                            (*(MppBuffer *)&pMStack_1a8->region[0].buf_offset,"vepu541_set_osd");
          if ((int)uVar5 < 0) {
            _mpp_log_l(2,"vepu541_common","invalid osd buffer fd %d\n","vepu541_set_osd",
                       (ulong)uVar5);
            return MPP_NOK;
          }
          *(uint *)((long)pvVar3 + (ulong)region._4_4_ * 4 + 0x1f0) = uVar5;
          if (pMStack_1a8->region[0].num_mb_x != 0) {
            mpp_dev_set_reg_offset(ctx,region._4_4_ + 0x7c,pMStack_1a8->region[0].num_mb_x);
          }
          if (((sVar8 & 0xffffffff) <
               (ulong)pMStack_1a8->region[0].num_mb_x + (ulong)(RVar1 * RVar2 * 0x100)) ||
             ((pMStack_1a8->region[0].num_mb_x & 0xf) != 0)) {
            _mpp_log_l(2,"vepu541_common","invalid osd cfg: %d x:y:w:h:off %d:%d:%d:%d:%x\n",
                       "vepu541_set_osd",(ulong)region._4_4_,(ulong)pMStack_1a8->region[0].enable,
                       pMStack_1a8->region[0].inverse,pMStack_1a8->region[0].start_mb_x,
                       pMStack_1a8->region[0].start_mb_y,pMStack_1a8->region[0].num_mb_x);
          }
        }
        pMStack_1a8 = (MppEncOSDData2 *)&pMStack_1a8->region[0].buf;
      }
      if (osd._4_4_ != 0) {
        *(uint *)((long)pvVar3 + 0x1c4) = *(uint *)((long)pvVar3 + 0x1c4) & 0xfffffff0 | 0xf;
      }
      if (osd.region[0].buf._4_4_ != 0) {
        *(uint *)((long)pvVar3 + 0x1c4) = *(uint *)((long)pvVar3 + 0x1c4) & 0xffffff0f | 0xf0;
      }
      if (osd.region[1].buf._4_4_ != 0) {
        *(uint *)((long)pvVar3 + 0x1c4) = *(uint *)((long)pvVar3 + 0x1c4) & 0xfffff0ff | 0xf00;
      }
      if (osd.region[2].buf._4_4_ != 0) {
        *(uint *)((long)pvVar3 + 0x1c4) = *(uint *)((long)pvVar3 + 0x1c4) & 0xffff0fff | 0xf000;
      }
      if (osd.region[3].buf._4_4_ != 0) {
        *(uint *)((long)pvVar3 + 0x1c4) = *(uint *)((long)pvVar3 + 0x1c4) & 0xfff0ffff | 0xf0000;
      }
      if (osd.region[4].buf._4_4_ != 0) {
        *(uint *)((long)pvVar3 + 0x1c4) = *(uint *)((long)pvVar3 + 0x1c4) & 0xff0fffff | 0xf00000;
      }
      if (osd.region[5].buf._4_4_ != 0) {
        *(uint *)((long)pvVar3 + 0x1c4) = *(uint *)((long)pvVar3 + 0x1c4) & 0xf0ffffff | 0xf000000;
      }
      if (osd.region[6].buf._4_4_ != 0) {
        *(uint *)((long)pvVar3 + 0x1c4) = *(uint *)((long)pvVar3 + 0x1c4) & 0xfffffff | 0xf0000000;
      }
      cfg_local._4_4_ = MPP_OK;
    }
    else {
      _mpp_log_l(2,"vepu541_common","do NOT support more than 8 regions invalid num %d\n",
                 "vepu541_set_osd",(ulong)wr_cfg.size);
      if ((8 < wr_cfg.size) &&
         (_mpp_log_l(2,"vepu541_common","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "osd.num_region <= 8","vepu541_set_osd",0x265), (mpp_debug & 0x10000000) != 0))
      {
        abort();
      }
      cfg_local._4_4_ = MPP_NOK;
    }
  }
  else {
    cfg_local._4_4_ = MPP_NOK;
  }
  return cfg_local._4_4_;
}

Assistant:

MPP_RET vepu541_set_osd(Vepu541OsdCfg *cfg)
{
    Vepu541OsdReg *regs = (Vepu541OsdReg *)(cfg->reg_base + (size_t)VEPU541_OSD_CFG_OFFSET);
    MppDev dev = cfg->dev;
    MppEncOSDPltCfg *plt_cfg = cfg->plt_cfg;
    MppEncOSDData2 osd;

    if (copy2osd2(&osd, cfg->osd_data, cfg->osd_data2))
        return MPP_NOK;

    if (osd.num_region == 0)
        return MPP_OK;

    if (osd.num_region > 8) {
        mpp_err_f("do NOT support more than 8 regions invalid num %d\n",
                  osd.num_region);
        mpp_assert(osd.num_region <= 8);
        return MPP_NOK;
    }

    if (plt_cfg->type == MPP_ENC_OSD_PLT_TYPE_USERDEF) {
        MppDevRegWrCfg wr_cfg;

        wr_cfg.reg = plt_cfg->plt;
        wr_cfg.size = sizeof(MppEncOSDPlt);
        wr_cfg.offset = VEPU541_REG_BASE_OSD_PLT;

        mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);

        regs->reg112.osd_plt_cks = 1;
        regs->reg112.osd_plt_typ = VEPU541_OSD_PLT_TYPE_USERDEF;
    } else {
        regs->reg112.osd_plt_cks = 0;
        regs->reg112.osd_plt_typ = VEPU541_OSD_PLT_TYPE_DEFAULT;
    }

    regs->reg112.osd_e = 0;
    regs->reg112.osd_inv_e = 0;

    RK_U32 i = 0;
    MppEncOSDRegion2 *region = osd.region;
    MppEncOSDRegion2 *tmp = region;
    RK_U32 num = osd.num_region;

    for (i = 0; i < num; i++, tmp++) {
        regs->reg112.osd_e      |= tmp->enable << i;
        regs->reg112.osd_inv_e  |= tmp->inverse << i;

        if (tmp->enable && tmp->num_mb_x && tmp->num_mb_y) {
            Vepu541OsdPos *pos = &regs->osd_pos[i];
            size_t blk_len = tmp->num_mb_x * tmp->num_mb_y * 256;
            RK_S32 fd = 0;
            RK_U32 buf_size = 0;

            pos->osd_lt_x = tmp->start_mb_x;
            pos->osd_lt_y = tmp->start_mb_y;
            pos->osd_rb_x = tmp->start_mb_x + tmp->num_mb_x - 1;
            pos->osd_rb_y = tmp->start_mb_y + tmp->num_mb_y - 1;

            buf_size = mpp_buffer_get_size(tmp->buf);
            fd = mpp_buffer_get_fd(tmp->buf);
            if (fd < 0) {
                mpp_err_f("invalid osd buffer fd %d\n", fd);
                return MPP_NOK;
            }
            regs->osd_addr[i] = fd;

            if (tmp->buf_offset)
                mpp_dev_set_reg_offset(dev, VEPU541_OSD_ADDR_IDX_BASE + i, tmp->buf_offset);

            /* There should be enough buffer and offset should be 16B aligned */
            if (buf_size < tmp->buf_offset + blk_len ||
                (tmp->buf_offset & 0xf)) {
                mpp_err_f("invalid osd cfg: %d x:y:w:h:off %d:%d:%d:%d:%x\n",
                          i, tmp->start_mb_x, tmp->start_mb_y,
                          tmp->num_mb_x, tmp->num_mb_y, tmp->buf_offset);
            }
        }
    }

    SET_OSD_INV_THR(0, regs->reg113, region);
    SET_OSD_INV_THR(1, regs->reg113, region);
    SET_OSD_INV_THR(2, regs->reg113, region);
    SET_OSD_INV_THR(3, regs->reg113, region);
    SET_OSD_INV_THR(4, regs->reg113, region);
    SET_OSD_INV_THR(5, regs->reg113, region);
    SET_OSD_INV_THR(6, regs->reg113, region);
    SET_OSD_INV_THR(7, regs->reg113, region);

    return MPP_OK;
}